

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool.cpp
# Opt level: O0

RPCHelpMan * testmempoolaccept(void)

{
  initializer_list<RPCArg> __l;
  initializer_list<RPCArg> __l_00;
  initializer_list<RPCResult> __l_01;
  initializer_list<RPCResult> __l_02;
  initializer_list<RPCResult> __l_03;
  initializer_list<RPCResult> __l_04;
  RPCHelpMan *in_RDI;
  undefined1 *puVar1;
  undefined1 *puVar2;
  long in_FS_OFFSET;
  allocator<RPCArg> *in_stack_ffffffffffffe5a8;
  allocator<RPCArg> *this;
  vector<RPCResult,_std::allocator<RPCResult>_> *pvVar3;
  allocator<RPCResult> *paVar4;
  RPCArg *this_00;
  UniValue *in_stack_ffffffffffffe5b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe5b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe5c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe5d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe5e0;
  UniValue *in_stack_ffffffffffffe5e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe5f0;
  undefined7 in_stack_ffffffffffffe5f8;
  undefined1 in_stack_ffffffffffffe5ff;
  string *in_stack_ffffffffffffe600;
  undefined7 in_stack_ffffffffffffe608;
  undefined1 in_stack_ffffffffffffe60f;
  undefined4 in_stack_ffffffffffffe610;
  Type in_stack_ffffffffffffe614;
  string *in_stack_ffffffffffffe618;
  undefined4 in_stack_ffffffffffffe620;
  Type in_stack_ffffffffffffe624;
  undefined4 in_stack_ffffffffffffe628;
  Type in_stack_ffffffffffffe62c;
  RPCArg *in_stack_ffffffffffffe630;
  RPCArgOptions *in_stack_ffffffffffffe650;
  undefined1 *local_1940;
  undefined1 *local_1928;
  RPCExamples *in_stack_ffffffffffffe6f0;
  RPCResults *in_stack_ffffffffffffe6f8;
  vector<RPCArg,_std::allocator<RPCArg>_> *in_stack_ffffffffffffe700;
  string *in_stack_ffffffffffffe708;
  string *in_stack_ffffffffffffe710;
  RPCHelpMan *in_stack_ffffffffffffe718;
  undefined1 *local_18e0;
  undefined1 *local_18c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *fun;
  undefined1 local_15f8 [39];
  allocator<char> local_15d1;
  allocator<char> local_15d0;
  allocator<char> local_15cf;
  allocator<char> local_15ce;
  allocator<char> local_15cd;
  allocator<char> local_15cc;
  allocator<char> local_15cb [3];
  pointer local_15c8;
  pointer pRStack_15c0;
  undefined1 local_15b8 [13];
  allocator<char> local_15ab [33];
  allocator<char> local_158a;
  allocator<char> local_1589 [31];
  allocator<char> local_156a;
  allocator<char> local_1569 [9];
  undefined8 uStack_1560;
  _Alloc_hider local_1558;
  allocator<char> local_1549;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1548;
  undefined1 local_1538 [46];
  allocator<char> local_150a;
  allocator<char> local_1509;
  pointer local_1508;
  pointer pbStack_1500;
  undefined8 local_14f8;
  allocator<char> local_14ea;
  allocator<char> local_14e9;
  undefined8 local_14e8;
  undefined8 uStack_14e0;
  undefined8 local_14d8;
  allocator<char> local_14ca;
  allocator<char> local_14c9;
  undefined8 local_14c8;
  undefined8 uStack_14c0;
  undefined8 local_14b8;
  allocator<char> local_14aa;
  allocator<char> local_14a9;
  undefined8 local_14a8;
  undefined8 uStack_14a0;
  undefined8 local_1498;
  allocator<char> local_148a;
  allocator<char> local_1489;
  undefined8 local_1488;
  undefined8 uStack_1480;
  undefined8 local_1478;
  allocator<char> local_146a;
  allocator<char> local_1469 [31];
  allocator<char> local_144a;
  allocator<char> local_1449 [31];
  allocator<char> local_142a;
  allocator<char> local_1429 [30];
  allocator<char> local_140b [2];
  allocator<char> local_1409;
  undefined4 local_1408;
  allocator<char> local_1401 [32];
  allocator<char> local_13e1;
  undefined4 local_13e0;
  allocator<char> local_13d9 [32];
  allocator<char> local_13b9 [769];
  undefined1 local_10b8 [136];
  undefined1 local_1030 [48];
  undefined8 local_1000;
  undefined1 local_f50 [408];
  undefined1 local_db8 [384];
  undefined1 local_c38 [952];
  undefined1 local_880 [64];
  undefined1 local_840 [136];
  undefined1 local_7b8 [200];
  undefined1 local_6f0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  undefined8 local_6b8;
  undefined1 local_6b0;
  undefined1 local_6af;
  allocator<RPCArg> local_570 [40];
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined1 local_530;
  undefined1 local_52f;
  undefined1 local_528;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 local_4f0;
  undefined1 local_4e8;
  undefined1 local_4e7;
  undefined1 local_440 [264];
  undefined1 local_338 [160];
  undefined1 local_298 [528];
  undefined1 local_88 [128];
  long local_8;
  
  local_1000 = 0;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe5ff,in_stack_ffffffffffffe5f8),
             (char *)in_stack_ffffffffffffe5f0,(allocator<char> *)in_stack_ffffffffffffe5e8);
  util::ToString<unsigned_int>((uint *)in_stack_ffffffffffffe5e0);
  std::operator+((char *)in_stack_ffffffffffffe5c0,in_stack_ffffffffffffe5b8);
  std::operator+(in_stack_ffffffffffffe5c0,(char *)in_stack_ffffffffffffe5b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe5ff,in_stack_ffffffffffffe5f8),
             (char *)in_stack_ffffffffffffe5f0,(allocator<char> *)in_stack_ffffffffffffe5e8);
  local_13e0 = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffe5b8,&in_stack_ffffffffffffe5b0->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe5ff,in_stack_ffffffffffffe5f8),
             (char *)in_stack_ffffffffffffe5f0,(allocator<char> *)in_stack_ffffffffffffe5e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe5ff,in_stack_ffffffffffffe5f8),
             (char *)in_stack_ffffffffffffe5f0,(allocator<char> *)in_stack_ffffffffffffe5e8);
  local_1408 = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffe5b8,&in_stack_ffffffffffffe5b0->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe5ff,in_stack_ffffffffffffe5f8),
             (char *)in_stack_ffffffffffffe5f0,(allocator<char> *)in_stack_ffffffffffffe5e8);
  local_528 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffe5c0);
  local_500 = 0;
  uStack_4f8 = 0;
  local_4f0 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffe5a8);
  local_4e8 = 0;
  local_4e7 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffe624,in_stack_ffffffffffffe620),
                 in_stack_ffffffffffffe618,in_stack_ffffffffffffe614,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffe60f,in_stack_ffffffffffffe608),
                 in_stack_ffffffffffffe600,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffe5ff,in_stack_ffffffffffffe5f8));
  std::allocator<RPCArg>::allocator(in_stack_ffffffffffffe5a8);
  __l._M_len._0_7_ = in_stack_ffffffffffffe5f8;
  __l._M_array = (iterator)in_stack_ffffffffffffe5f0;
  __l._M_len._7_1_ = in_stack_ffffffffffffe5ff;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffe5e8,__l,
             (allocator_type *)in_stack_ffffffffffffe5e0);
  local_570[0] = (allocator<RPCArg>)0x0;
  std::__cxx11::string::string(in_stack_ffffffffffffe5c0);
  local_548 = 0;
  uStack_540 = 0;
  local_538 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffe5a8);
  local_530 = 0;
  local_52f = 0;
  this = local_570;
  RPCArg::RPCArg(in_stack_ffffffffffffe630,
                 (string *)CONCAT44(in_stack_ffffffffffffe62c,in_stack_ffffffffffffe628),
                 in_stack_ffffffffffffe624,(Fallback *)in_stack_ffffffffffffe618,
                 (string *)CONCAT44(in_stack_ffffffffffffe614,in_stack_ffffffffffffe610),
                 (vector<RPCArg,_std::allocator<RPCArg>_> *)
                 CONCAT17(in_stack_ffffffffffffe60f,in_stack_ffffffffffffe608),
                 in_stack_ffffffffffffe650);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe5ff,in_stack_ffffffffffffe5f8),
             (char *)in_stack_ffffffffffffe5f0,(allocator<char> *)in_stack_ffffffffffffe5e8);
  CFeeRate::GetFeePerK((CFeeRate *)this);
  FormatMoney_abi_cxx11_((CAmount)in_stack_ffffffffffffe600);
  UniValue::
  UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (in_stack_ffffffffffffe5e8,in_stack_ffffffffffffe5e0);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffe5b8,in_stack_ffffffffffffe5b0);
  std::operator+((char *)CONCAT17(in_stack_ffffffffffffe5ff,in_stack_ffffffffffffe5f8),
                 in_stack_ffffffffffffe5f0);
  std::operator+(in_stack_ffffffffffffe5c0,(char *)in_stack_ffffffffffffe5b8);
  local_6f0 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffe5c0);
  local_6c8 = 0;
  uStack_6c0 = 0;
  local_6b8 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)this);
  local_6b0 = 0;
  local_6af = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffe624,in_stack_ffffffffffffe620),
                 in_stack_ffffffffffffe618,in_stack_ffffffffffffe614,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffe60f,in_stack_ffffffffffffe608),
                 in_stack_ffffffffffffe600,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffe5ff,in_stack_ffffffffffffe5f8));
  std::allocator<RPCArg>::allocator(this);
  __l_00._M_len._0_7_ = in_stack_ffffffffffffe5f8;
  __l_00._M_array = (iterator)in_stack_ffffffffffffe5f0;
  __l_00._M_len._7_1_ = in_stack_ffffffffffffe5ff;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffe5e8,__l_00,
             (allocator_type *)in_stack_ffffffffffffe5e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe5ff,in_stack_ffffffffffffe5f8),
             (char *)in_stack_ffffffffffffe5f0,(allocator<char> *)in_stack_ffffffffffffe5e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe5ff,in_stack_ffffffffffffe5f8),
             (char *)in_stack_ffffffffffffe5f0,(allocator<char> *)in_stack_ffffffffffffe5e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe5ff,in_stack_ffffffffffffe5f8),
             (char *)in_stack_ffffffffffffe5f0,(allocator<char> *)in_stack_ffffffffffffe5e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe5ff,in_stack_ffffffffffffe5f8),
             (char *)in_stack_ffffffffffffe5f0,(allocator<char> *)in_stack_ffffffffffffe5e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe5ff,in_stack_ffffffffffffe5f8),
             (char *)in_stack_ffffffffffffe5f0,(allocator<char> *)in_stack_ffffffffffffe5e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe5ff,in_stack_ffffffffffffe5f8),
             (char *)in_stack_ffffffffffffe5f0,(allocator<char> *)in_stack_ffffffffffffe5e8);
  local_1488 = 0;
  uStack_1480 = 0;
  local_1478 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)this);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffe630,in_stack_ffffffffffffe62c,
             (string *)CONCAT44(in_stack_ffffffffffffe624,in_stack_ffffffffffffe620),
             in_stack_ffffffffffffe618,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe614,in_stack_ffffffffffffe610),
             (bool)in_stack_ffffffffffffe60f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe5ff,in_stack_ffffffffffffe5f8),
             (char *)in_stack_ffffffffffffe5f0,(allocator<char> *)in_stack_ffffffffffffe5e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe5ff,in_stack_ffffffffffffe5f8),
             (char *)in_stack_ffffffffffffe5f0,(allocator<char> *)in_stack_ffffffffffffe5e8);
  local_14a8 = 0;
  uStack_14a0 = 0;
  local_1498 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)this);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffe630,in_stack_ffffffffffffe62c,
             (string *)CONCAT44(in_stack_ffffffffffffe624,in_stack_ffffffffffffe620),
             in_stack_ffffffffffffe618,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe614,in_stack_ffffffffffffe610),
             (bool)in_stack_ffffffffffffe60f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe5ff,in_stack_ffffffffffffe5f8),
             (char *)in_stack_ffffffffffffe5f0,(allocator<char> *)in_stack_ffffffffffffe5e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe5ff,in_stack_ffffffffffffe5f8),
             (char *)in_stack_ffffffffffffe5f0,(allocator<char> *)in_stack_ffffffffffffe5e8);
  local_14c8 = 0;
  uStack_14c0 = 0;
  local_14b8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)this);
  pvVar3 = (vector<RPCResult,_std::allocator<RPCResult>_> *)((ulong)this & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffe62c,in_stack_ffffffffffffe628),
             in_stack_ffffffffffffe624,in_stack_ffffffffffffe618,
             SUB41(in_stack_ffffffffffffe614 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffe60f,in_stack_ffffffffffffe608),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe600,
             (bool)in_stack_ffffffffffffe5ff);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe5ff,in_stack_ffffffffffffe5f8),
             (char *)in_stack_ffffffffffffe5f0,(allocator<char> *)in_stack_ffffffffffffe5e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe5ff,in_stack_ffffffffffffe5f8),
             (char *)in_stack_ffffffffffffe5f0,(allocator<char> *)in_stack_ffffffffffffe5e8);
  local_14e8 = 0;
  uStack_14e0 = 0;
  local_14d8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar3);
  pvVar3 = (vector<RPCResult,_std::allocator<RPCResult>_> *)((ulong)pvVar3 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffe62c,in_stack_ffffffffffffe628),
             in_stack_ffffffffffffe624,in_stack_ffffffffffffe618,
             SUB41(in_stack_ffffffffffffe614 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffe60f,in_stack_ffffffffffffe608),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe600,
             (bool)in_stack_ffffffffffffe5ff);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe5ff,in_stack_ffffffffffffe5f8),
             (char *)in_stack_ffffffffffffe5f0,(allocator<char> *)in_stack_ffffffffffffe5e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe5ff,in_stack_ffffffffffffe5f8),
             (char *)in_stack_ffffffffffffe5f0,(allocator<char> *)in_stack_ffffffffffffe5e8);
  local_1508 = (pointer)0x0;
  pbStack_1500 = (pointer)0x0;
  local_14f8._0_1_ = false;
  local_14f8._1_1_ = false;
  local_14f8._2_6_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar3);
  pvVar3 = (vector<RPCResult,_std::allocator<RPCResult>_> *)((ulong)pvVar3 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffe62c,in_stack_ffffffffffffe628),
             in_stack_ffffffffffffe624,in_stack_ffffffffffffe618,
             SUB41(in_stack_ffffffffffffe614 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffe60f,in_stack_ffffffffffffe608),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe600,
             (bool)in_stack_ffffffffffffe5ff);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe5ff,in_stack_ffffffffffffe5f8),
             (char *)in_stack_ffffffffffffe5f0,(allocator<char> *)in_stack_ffffffffffffe5e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe5ff,in_stack_ffffffffffffe5f8),
             (char *)in_stack_ffffffffffffe5f0,(allocator<char> *)in_stack_ffffffffffffe5e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe5ff,in_stack_ffffffffffffe5f8),
             (char *)in_stack_ffffffffffffe5f0,(allocator<char> *)in_stack_ffffffffffffe5e8);
  std::operator+((char *)CONCAT17(in_stack_ffffffffffffe5ff,in_stack_ffffffffffffe5f8),
                 in_stack_ffffffffffffe5f0);
  local_1548._M_allocated_capacity = 0;
  local_1548._8_8_ = 0;
  local_1538._0_8_ = 0;
  fun = &local_1548;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar3);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffe630,in_stack_ffffffffffffe62c,
             (string *)CONCAT44(in_stack_ffffffffffffe624,in_stack_ffffffffffffe620),
             in_stack_ffffffffffffe618,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe614,in_stack_ffffffffffffe610),
             (bool)in_stack_ffffffffffffe60f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe5ff,in_stack_ffffffffffffe5f8),
             (char *)in_stack_ffffffffffffe5f0,(allocator<char> *)in_stack_ffffffffffffe5e8);
  std::operator+((char *)CONCAT17(in_stack_ffffffffffffe5ff,in_stack_ffffffffffffe5f8),
                 in_stack_ffffffffffffe5f0);
  std::operator+(in_stack_ffffffffffffe5c0,(char *)in_stack_ffffffffffffe5b8);
  local_1569[1] = (allocator<char>)0x0;
  local_1569[2] = (allocator<char>)0x0;
  local_1569[3] = (allocator<char>)0x0;
  local_1569[4] = (allocator<char>)0x0;
  local_1569[5] = (allocator<char>)0x0;
  local_1569[6] = (allocator<char>)0x0;
  local_1569[7] = (allocator<char>)0x0;
  local_1569[8] = (allocator<char>)0x0;
  uStack_1560._0_1_ = '\0';
  uStack_1560._1_7_ = 0;
  local_1558._M_p = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar3);
  paVar4 = (allocator<RPCResult> *)((ulong)pvVar3 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffe62c,in_stack_ffffffffffffe628),
             in_stack_ffffffffffffe624,in_stack_ffffffffffffe618,
             SUB41(in_stack_ffffffffffffe614 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffe60f,in_stack_ffffffffffffe608),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe600,
             (bool)in_stack_ffffffffffffe5ff);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe5ff,in_stack_ffffffffffffe5f8),
             (char *)in_stack_ffffffffffffe5f0,(allocator<char> *)in_stack_ffffffffffffe5e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe5ff,in_stack_ffffffffffffe5f8),
             (char *)in_stack_ffffffffffffe5f0,(allocator<char> *)in_stack_ffffffffffffe5e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe5ff,in_stack_ffffffffffffe5f8),
             (char *)in_stack_ffffffffffffe5f0,(allocator<char> *)in_stack_ffffffffffffe5e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe5ff,in_stack_ffffffffffffe5f8),
             (char *)in_stack_ffffffffffffe5f0,(allocator<char> *)in_stack_ffffffffffffe5e8);
  local_15ab[3] = (allocator<char>)0x0;
  local_15ab[4] = (allocator<char>)0x0;
  local_15ab[5] = (allocator<char>)0x0;
  local_15ab[6] = (allocator<char>)0x0;
  local_15ab[7] = (allocator<char>)0x0;
  local_15ab[8] = (allocator<char>)0x0;
  local_15ab[9] = (allocator<char>)0x0;
  local_15ab[10] = (allocator<char>)0x0;
  local_15ab[0xb] = (allocator<char>)0x0;
  local_15ab[0xc] = (allocator<char>)0x0;
  local_15ab[0xd] = (allocator<char>)0x0;
  local_15ab[0xe] = (allocator<char>)0x0;
  local_15ab[0xf] = (allocator<char>)0x0;
  local_15ab[0x10] = (allocator<char>)0x0;
  local_15ab[0x11] = (allocator<char>)0x0;
  local_15ab[0x12] = (allocator<char>)0x0;
  local_15ab[0x13] = (allocator<char>)0x0;
  local_15ab[0x14] = (allocator<char>)0x0;
  local_15ab[0x15] = (allocator<char>)0x0;
  local_15ab[0x16] = (allocator<char>)0x0;
  local_15ab[0x17] = (allocator<char>)0x0;
  local_15ab[0x18] = (allocator<char>)0x0;
  local_15ab[0x19] = (allocator<char>)0x0;
  local_15ab[0x1a] = (allocator<char>)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar4);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffe630,in_stack_ffffffffffffe62c,
             (string *)CONCAT44(in_stack_ffffffffffffe624,in_stack_ffffffffffffe620),
             in_stack_ffffffffffffe618,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe614,in_stack_ffffffffffffe610),
             (bool)in_stack_ffffffffffffe60f);
  std::allocator<RPCResult>::allocator(paVar4);
  __l_01._M_len._0_7_ = in_stack_ffffffffffffe5f8;
  __l_01._M_array = (iterator)in_stack_ffffffffffffe5f0;
  __l_01._M_len._7_1_ = in_stack_ffffffffffffe5ff;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe5e8,__l_01,
             (allocator_type *)in_stack_ffffffffffffe5e0);
  paVar4 = (allocator<RPCResult> *)((ulong)paVar4 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffe62c,in_stack_ffffffffffffe628),
             in_stack_ffffffffffffe624,in_stack_ffffffffffffe618,
             SUB41(in_stack_ffffffffffffe614 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffe60f,in_stack_ffffffffffffe608),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe600,
             (bool)in_stack_ffffffffffffe5ff);
  std::allocator<RPCResult>::allocator(paVar4);
  __l_02._M_len._0_7_ = in_stack_ffffffffffffe5f8;
  __l_02._M_array = (iterator)in_stack_ffffffffffffe5f0;
  __l_02._M_len._7_1_ = in_stack_ffffffffffffe5ff;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe5e8,__l_02,
             (allocator_type *)in_stack_ffffffffffffe5e0);
  pvVar3 = (vector<RPCResult,_std::allocator<RPCResult>_> *)((ulong)paVar4 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffe62c,in_stack_ffffffffffffe628),
             in_stack_ffffffffffffe624,in_stack_ffffffffffffe618,
             SUB41(in_stack_ffffffffffffe614 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffe60f,in_stack_ffffffffffffe608),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe600,
             (bool)in_stack_ffffffffffffe5ff);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe5ff,in_stack_ffffffffffffe5f8),
             (char *)in_stack_ffffffffffffe5f0,(allocator<char> *)in_stack_ffffffffffffe5e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe5ff,in_stack_ffffffffffffe5f8),
             (char *)in_stack_ffffffffffffe5f0,(allocator<char> *)in_stack_ffffffffffffe5e8);
  local_15c8 = (pointer)0x0;
  pRStack_15c0 = (pointer)0x0;
  local_15b8._0_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar3);
  paVar4 = (allocator<RPCResult> *)((ulong)pvVar3 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffe62c,in_stack_ffffffffffffe628),
             in_stack_ffffffffffffe624,in_stack_ffffffffffffe618,
             SUB41(in_stack_ffffffffffffe614 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffe60f,in_stack_ffffffffffffe608),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe600,
             (bool)in_stack_ffffffffffffe5ff);
  std::allocator<RPCResult>::allocator(paVar4);
  __l_03._M_len._0_7_ = in_stack_ffffffffffffe5f8;
  __l_03._M_array = (iterator)in_stack_ffffffffffffe5f0;
  __l_03._M_len._7_1_ = in_stack_ffffffffffffe5ff;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe5e8,__l_03,
             (allocator_type *)in_stack_ffffffffffffe5e0);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffe630,in_stack_ffffffffffffe62c,
             (string *)CONCAT44(in_stack_ffffffffffffe624,in_stack_ffffffffffffe620),
             in_stack_ffffffffffffe618,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe614,in_stack_ffffffffffffe610),
             (bool)in_stack_ffffffffffffe60f);
  std::allocator<RPCResult>::allocator(paVar4);
  __l_04._M_len._0_7_ = in_stack_ffffffffffffe5f8;
  __l_04._M_array = (iterator)in_stack_ffffffffffffe5f0;
  __l_04._M_len._7_1_ = in_stack_ffffffffffffe5ff;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe5e8,__l_04,
             (allocator_type *)in_stack_ffffffffffffe5e0);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffe630,in_stack_ffffffffffffe62c,
             (string *)CONCAT44(in_stack_ffffffffffffe624,in_stack_ffffffffffffe620),
             in_stack_ffffffffffffe618,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe614,in_stack_ffffffffffffe610),
             (bool)in_stack_ffffffffffffe60f);
  RPCResults::RPCResults
            ((RPCResults *)CONCAT44(in_stack_ffffffffffffe62c,in_stack_ffffffffffffe628),
             (RPCResult *)CONCAT44(in_stack_ffffffffffffe624,in_stack_ffffffffffffe620));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe5ff,in_stack_ffffffffffffe5f8),
             (char *)in_stack_ffffffffffffe5f0,(allocator<char> *)in_stack_ffffffffffffe5e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe5ff,in_stack_ffffffffffffe5f8),
             (char *)in_stack_ffffffffffffe5f0,(allocator<char> *)in_stack_ffffffffffffe5e8);
  HelpExampleCli(in_stack_ffffffffffffe5e0,in_stack_ffffffffffffe5d8);
  std::operator+((char *)in_stack_ffffffffffffe5c0,in_stack_ffffffffffffe5b8);
  std::operator+(in_stack_ffffffffffffe5c0,(char *)in_stack_ffffffffffffe5b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe5ff,in_stack_ffffffffffffe5f8),
             (char *)in_stack_ffffffffffffe5f0,(allocator<char> *)in_stack_ffffffffffffe5e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe5ff,in_stack_ffffffffffffe5f8),
             (char *)in_stack_ffffffffffffe5f0,(allocator<char> *)in_stack_ffffffffffffe5e8);
  HelpExampleCli(in_stack_ffffffffffffe5e0,in_stack_ffffffffffffe5d8);
  std::operator+(in_stack_ffffffffffffe5e0,in_stack_ffffffffffffe5d8);
  std::operator+(in_stack_ffffffffffffe5c0,(char *)in_stack_ffffffffffffe5b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe5ff,in_stack_ffffffffffffe5f8),
             (char *)in_stack_ffffffffffffe5f0,(allocator<char> *)in_stack_ffffffffffffe5e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe5ff,in_stack_ffffffffffffe5f8),
             (char *)in_stack_ffffffffffffe5f0,(allocator<char> *)in_stack_ffffffffffffe5e8);
  HelpExampleCli(in_stack_ffffffffffffe5e0,in_stack_ffffffffffffe5d8);
  std::operator+(in_stack_ffffffffffffe5e0,in_stack_ffffffffffffe5d8);
  std::operator+(in_stack_ffffffffffffe5c0,(char *)in_stack_ffffffffffffe5b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe5ff,in_stack_ffffffffffffe5f8),
             (char *)in_stack_ffffffffffffe5f0,(allocator<char> *)in_stack_ffffffffffffe5e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe5ff,in_stack_ffffffffffffe5f8),
             (char *)in_stack_ffffffffffffe5f0,(allocator<char> *)in_stack_ffffffffffffe5e8);
  HelpExampleRpc(in_stack_ffffffffffffe5e0,in_stack_ffffffffffffe5d8);
  std::operator+(in_stack_ffffffffffffe5e0,in_stack_ffffffffffffe5d8);
  RPCExamples::RPCExamples((RPCExamples *)paVar4,(string *)0x12f27a2);
  this_00 = (RPCArg *)local_15f8;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<testmempoolaccept()::__0,void>
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)
             in_stack_ffffffffffffe5b8,(anon_class_1_0_00000001 *)in_stack_ffffffffffffe5b0);
  RPCHelpMan::RPCHelpMan
            (in_stack_ffffffffffffe718,in_stack_ffffffffffffe710,in_stack_ffffffffffffe708,
             in_stack_ffffffffffffe700,in_stack_ffffffffffffe6f8,in_stack_ffffffffffffe6f0,
             (RPCMethodImpl *)fun);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this_00);
  RPCExamples::~RPCExamples((RPCExamples *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_15f8 + 0x26));
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_15d1);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_15d0);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_15cf);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_15ce);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_15cd);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_15cc);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_15cb);
  RPCResults::~RPCResults((RPCResults *)this_00);
  RPCResult::~RPCResult((RPCResult *)this_00);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe5b8);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_00);
  local_18c8 = local_7b8;
  do {
    local_18c8 = local_18c8 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this_00);
  } while (local_18c8 != local_840);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe5b8);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_00);
  puVar2 = local_c38;
  local_18e0 = local_880;
  do {
    local_18e0 = local_18e0 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this_00);
  } while (local_18e0 != puVar2);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe5b8);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_15b8 + 0xc));
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_15ab);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe5b8);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_00);
  puVar2 = local_f50;
  puVar1 = local_db8;
  do {
    puVar1 = puVar1 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this_00);
  } while (puVar1 != puVar2);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe5b8);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_00);
  puVar2 = local_1030;
  do {
    puVar2 = puVar2 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this_00);
  } while (puVar2 != local_10b8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe5b8);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_158a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_1589);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_156a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_1569);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe5b8);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1549);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe5b8);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_1538 + 0xf));
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_150a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1509);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe5b8);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_14ea);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_14e9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe5b8);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_14ca);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_14c9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe5b8);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_14aa);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_14a9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe5b8);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_148a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1489);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe5b8);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_146a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_1469);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_144a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_1449);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_142a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_1429);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffe5b8);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this_00);
  local_1928 = local_88;
  do {
    local_1928 = local_1928 + -0x108;
    RPCArg::~RPCArg(this_00);
  } while (local_1928 != local_298);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  UniValue::~UniValue((UniValue *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_140b);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffe5b8);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this_00);
  local_1940 = local_338;
  do {
    local_1940 = local_1940 + -0x108;
    RPCArg::~RPCArg(this_00);
  } while (local_1940 != local_440);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1409);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_1401);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_13e1);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_13d9);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_13b9);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan testmempoolaccept()
{
    return RPCHelpMan{"testmempoolaccept",
        "\nReturns result of mempool acceptance tests indicating if raw transaction(s) (serialized, hex-encoded) would be accepted by mempool.\n"
        "\nIf multiple transactions are passed in, parents must come before children and package policies apply: the transactions cannot conflict with any mempool transactions or each other.\n"
        "\nIf one transaction fails, other transactions may not be fully validated (the 'allowed' key will be blank).\n"
        "\nThe maximum number of transactions allowed is " + ToString(MAX_PACKAGE_COUNT) + ".\n"
        "\nThis checks if transactions violate the consensus or policy rules.\n"
        "\nSee sendrawtransaction call.\n",
        {
            {"rawtxs", RPCArg::Type::ARR, RPCArg::Optional::NO, "An array of hex strings of raw transactions.",
                {
                    {"rawtx", RPCArg::Type::STR_HEX, RPCArg::Optional::OMITTED, ""},
                },
            },
            {"maxfeerate", RPCArg::Type::AMOUNT, RPCArg::Default{FormatMoney(DEFAULT_MAX_RAW_TX_FEE_RATE.GetFeePerK())},
             "Reject transactions whose fee rate is higher than the specified value, expressed in " + CURRENCY_UNIT +
                 "/kvB.\nFee rates larger than 1BTC/kvB are rejected.\nSet to 0 to accept any fee rate."},
        },
        RPCResult{
            RPCResult::Type::ARR, "", "The result of the mempool acceptance test for each raw transaction in the input array.\n"
                                      "Returns results for each transaction in the same order they were passed in.\n"
                                      "Transactions that cannot be fully validated due to failures in other transactions will not contain an 'allowed' result.\n",
            {
                {RPCResult::Type::OBJ, "", "",
                {
                    {RPCResult::Type::STR_HEX, "txid", "The transaction hash in hex"},
                    {RPCResult::Type::STR_HEX, "wtxid", "The transaction witness hash in hex"},
                    {RPCResult::Type::STR, "package-error", /*optional=*/true, "Package validation error, if any (only possible if rawtxs had more than 1 transaction)."},
                    {RPCResult::Type::BOOL, "allowed", /*optional=*/true, "Whether this tx would be accepted to the mempool and pass client-specified maxfeerate. "
                                                       "If not present, the tx was not fully validated due to a failure in another tx in the list."},
                    {RPCResult::Type::NUM, "vsize", /*optional=*/true, "Virtual transaction size as defined in BIP 141. This is different from actual serialized size for witness transactions as witness data is discounted (only present when 'allowed' is true)"},
                    {RPCResult::Type::OBJ, "fees", /*optional=*/true, "Transaction fees (only present if 'allowed' is true)",
                    {
                        {RPCResult::Type::STR_AMOUNT, "base", "transaction fee in " + CURRENCY_UNIT},
                        {RPCResult::Type::STR_AMOUNT, "effective-feerate", /*optional=*/false, "the effective feerate in " + CURRENCY_UNIT + " per KvB. May differ from the base feerate if, for example, there are modified fees from prioritisetransaction or a package feerate was used."},
                        {RPCResult::Type::ARR, "effective-includes", /*optional=*/false, "transactions whose fees and vsizes are included in effective-feerate.",
                            {RPCResult{RPCResult::Type::STR_HEX, "", "transaction wtxid in hex"},
                        }},
                    }},
                    {RPCResult::Type::STR, "reject-reason", /*optional=*/true, "Rejection string (only present when 'allowed' is false)"},
                }},
            }
        },
        RPCExamples{
            "\nCreate a transaction\n"
            + HelpExampleCli("createrawtransaction", "\"[{\\\"txid\\\" : \\\"mytxid\\\",\\\"vout\\\":0}]\" \"{\\\"myaddress\\\":0.01}\"") +
            "Sign the transaction, and get back the hex\n"
            + HelpExampleCli("signrawtransactionwithwallet", "\"myhex\"") +
            "\nTest acceptance of the transaction (signed hex)\n"
            + HelpExampleCli("testmempoolaccept", R"('["signedhex"]')") +
            "\nAs a JSON-RPC call\n"
            + HelpExampleRpc("testmempoolaccept", "[\"signedhex\"]")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
        {
            const UniValue raw_transactions = request.params[0].get_array();
            if (raw_transactions.size() < 1 || raw_transactions.size() > MAX_PACKAGE_COUNT) {
                throw JSONRPCError(RPC_INVALID_PARAMETER,
                                   "Array must contain between 1 and " + ToString(MAX_PACKAGE_COUNT) + " transactions.");
            }

            const CFeeRate max_raw_tx_fee_rate{ParseFeeRate(self.Arg<UniValue>("maxfeerate"))};

            std::vector<CTransactionRef> txns;
            txns.reserve(raw_transactions.size());
            for (const auto& rawtx : raw_transactions.getValues()) {
                CMutableTransaction mtx;
                if (!DecodeHexTx(mtx, rawtx.get_str())) {
                    throw JSONRPCError(RPC_DESERIALIZATION_ERROR,
                                       "TX decode failed: " + rawtx.get_str() + " Make sure the tx has at least one input.");
                }
                txns.emplace_back(MakeTransactionRef(std::move(mtx)));
            }

            NodeContext& node = EnsureAnyNodeContext(request.context);
            CTxMemPool& mempool = EnsureMemPool(node);
            ChainstateManager& chainman = EnsureChainman(node);
            Chainstate& chainstate = chainman.ActiveChainstate();
            const PackageMempoolAcceptResult package_result = [&] {
                LOCK(::cs_main);
                if (txns.size() > 1) return ProcessNewPackage(chainstate, mempool, txns, /*test_accept=*/true, /*client_maxfeerate=*/{});
                return PackageMempoolAcceptResult(txns[0]->GetWitnessHash(),
                                                  chainman.ProcessTransaction(txns[0], /*test_accept=*/true));
            }();

            UniValue rpc_result(UniValue::VARR);
            // We will check transaction fees while we iterate through txns in order. If any transaction fee
            // exceeds maxfeerate, we will leave the rest of the validation results blank, because it
            // doesn't make sense to return a validation result for a transaction if its ancestor(s) would
            // not be submitted.
            bool exit_early{false};
            for (const auto& tx : txns) {
                UniValue result_inner(UniValue::VOBJ);
                result_inner.pushKV("txid", tx->GetHash().GetHex());
                result_inner.pushKV("wtxid", tx->GetWitnessHash().GetHex());
                if (package_result.m_state.GetResult() == PackageValidationResult::PCKG_POLICY) {
                    result_inner.pushKV("package-error", package_result.m_state.ToString());
                }
                auto it = package_result.m_tx_results.find(tx->GetWitnessHash());
                if (exit_early || it == package_result.m_tx_results.end()) {
                    // Validation unfinished. Just return the txid and wtxid.
                    rpc_result.push_back(std::move(result_inner));
                    continue;
                }
                const auto& tx_result = it->second;
                // Package testmempoolaccept doesn't allow transactions to already be in the mempool.
                CHECK_NONFATAL(tx_result.m_result_type != MempoolAcceptResult::ResultType::MEMPOOL_ENTRY);
                if (tx_result.m_result_type == MempoolAcceptResult::ResultType::VALID) {
                    const CAmount fee = tx_result.m_base_fees.value();
                    // Check that fee does not exceed maximum fee
                    const int64_t virtual_size = tx_result.m_vsize.value();
                    const CAmount max_raw_tx_fee = max_raw_tx_fee_rate.GetFee(virtual_size);
                    if (max_raw_tx_fee && fee > max_raw_tx_fee) {
                        result_inner.pushKV("allowed", false);
                        result_inner.pushKV("reject-reason", "max-fee-exceeded");
                        exit_early = true;
                    } else {
                        // Only return the fee and vsize if the transaction would pass ATMP.
                        // These can be used to calculate the feerate.
                        result_inner.pushKV("allowed", true);
                        result_inner.pushKV("vsize", virtual_size);
                        UniValue fees(UniValue::VOBJ);
                        fees.pushKV("base", ValueFromAmount(fee));
                        fees.pushKV("effective-feerate", ValueFromAmount(tx_result.m_effective_feerate.value().GetFeePerK()));
                        UniValue effective_includes_res(UniValue::VARR);
                        for (const auto& wtxid : tx_result.m_wtxids_fee_calculations.value()) {
                            effective_includes_res.push_back(wtxid.ToString());
                        }
                        fees.pushKV("effective-includes", std::move(effective_includes_res));
                        result_inner.pushKV("fees", std::move(fees));
                    }
                } else {
                    result_inner.pushKV("allowed", false);
                    const TxValidationState state = tx_result.m_state;
                    if (state.GetResult() == TxValidationResult::TX_MISSING_INPUTS) {
                        result_inner.pushKV("reject-reason", "missing-inputs");
                    } else {
                        result_inner.pushKV("reject-reason", state.GetRejectReason());
                    }
                }
                rpc_result.push_back(std::move(result_inner));
            }
            return rpc_result;
        },
    };
}